

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O3

int mdb_dbi_open(MDB_txn *txn,char *name,uint flags,MDB_dbi *dbi)

{
  MDB_dbx *pMVar1;
  uint *puVar2;
  MDB_db *pMVar3;
  long lVar4;
  pgno_t pVar5;
  pgno_t pVar6;
  pgno_t pVar7;
  pgno_t pVar8;
  bool bVar9;
  uchar uVar10;
  int iVar11;
  size_t __n;
  char *__ptr;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  void **ppvVar16;
  int exact;
  MDB_val data;
  MDB_val key;
  MDB_cursor mc;
  int local_21c;
  size_t local_218;
  char *local_210;
  MDB_val local_208;
  MDB_val local_1f8;
  long local_1e8 [6];
  MDB_cursor local_1b8;
  
  if ((flags & 0xfffbff81) != 0) {
    return 0x16;
  }
  if ((txn->mt_flags & 0x13) != 0) {
    return -0x783e;
  }
  if (name == (char *)0x0) {
    *dbi = 1;
    pMVar3 = txn->mt_dbs;
    if (((flags & 0x7e) != 0) &&
       (uVar13 = flags & 0x7e | (uint)pMVar3[1].md_flags, uVar13 != pMVar3[1].md_flags)) {
      pMVar3[1].md_flags = (uint16_t)uVar13;
      *(byte *)&txn->mt_flags = (byte)txn->mt_flags | 4;
    }
    mdb_default_cmp((MDB_txn *)txn->mt_dbxs,(MDB_dbi)pMVar3);
    return 0;
  }
  if (((MDB_txn *)txn->mt_dbxs)->mt_spill_pgs == (MDB_IDL)0x0) {
    mdb_default_cmp((MDB_txn *)txn->mt_dbxs,(MDB_dbi)txn->mt_dbs);
  }
  __n = strlen(name);
  uVar13 = txn->mt_numdbs;
  if (2 < (ulong)uVar13) {
    ppvVar16 = &txn->mt_dbxs[2].md_name.mv_data;
    uVar14 = 0;
    uVar15 = 2;
    local_210 = name;
    do {
      if (((MDB_val *)(ppvVar16 + -1))->mv_size == 0) {
        if ((int)uVar14 == 0) {
          uVar14 = uVar15 & 0xffffffff;
        }
      }
      else if ((__n == ((MDB_val *)(ppvVar16 + -1))->mv_size) &&
              (iVar11 = strncmp(name,(char *)*ppvVar16,__n), name = local_210, iVar11 == 0)) {
        *dbi = (MDB_dbi)uVar15;
        return 0;
      }
      uVar12 = (uint)uVar14;
      uVar15 = uVar15 + 1;
      ppvVar16 = ppvVar16 + 6;
    } while (uVar13 != uVar15);
    if (uVar12 != 0) {
      bVar9 = false;
      goto LAB_0010b819;
    }
  }
  if (txn->mt_env->me_maxdbs <= uVar13) {
    return -0x7847;
  }
  uVar12 = 0;
  bVar9 = true;
LAB_0010b819:
  if ((txn->mt_dbs[1].md_flags & 0xc) != 0) {
    if (flags < 0x40000) {
      return -0x784e;
    }
    return -0x7840;
  }
  local_21c = 0;
  local_1f8.mv_size = __n;
  local_1f8.mv_data = name;
  mdb_cursor_init(&local_1b8,txn,1,(MDB_xcursor *)0x0);
  iVar11 = mdb_cursor_set(&local_1b8,&local_1f8,&local_208,MDB_SET,&local_21c);
  local_218 = __n;
  if (iVar11 == -0x784e) {
    if (flags < 0x40000) {
      return -0x784e;
    }
    __ptr = strdup(name);
    if (__ptr == (char *)0x0) {
      return 0xc;
    }
    local_208.mv_size = 0x30;
    local_208.mv_data = local_1e8;
    local_1e8[1] = 0;
    local_1e8[2] = 0;
    local_1e8[3] = 0;
    local_1e8[4] = 0;
    local_1e8[5] = 0xffffffffffffffff;
    local_1e8[0] = (ulong)(ushort)flags << 0x20;
    iVar11 = mdb_cursor_put(&local_1b8,&local_1f8,&local_208,2);
    if (iVar11 != 0) {
      free(__ptr);
      return iVar11;
    }
    uVar10 = '\x1d';
  }
  else {
    if (iVar11 != 0) {
      return iVar11;
    }
    if ((*(ushort *)
          ((long)local_1b8.mc_pg[local_1b8.mc_top]->mp_ptrs +
          ((ulong)local_1b8.mc_pg[local_1b8.mc_top]->mp_ptrs[local_1b8.mc_ki[local_1b8.mc_top]] -
          0xc)) & 6) != 2) {
      return -0x7840;
    }
    __ptr = strdup(name);
    if (__ptr == (char *)0x0) {
      return 0xc;
    }
    uVar10 = '\x1c';
  }
  if (bVar9) {
    uVar12 = txn->mt_numdbs;
  }
  pMVar1 = txn->mt_dbxs;
  pMVar1[uVar12].md_name.mv_data = __ptr;
  pMVar1[uVar12].md_name.mv_size = local_218;
  pMVar1[uVar12].md_rel = (MDB_rel_func *)0x0;
  txn->mt_dbflags[uVar12] = uVar10;
  puVar2 = txn->mt_env->me_dbiseqs;
  uVar13 = puVar2[uVar12] + 1;
  puVar2[uVar12] = uVar13;
  txn->mt_dbiseqs[uVar12] = uVar13;
  pMVar3 = txn->mt_dbs;
  lVar4 = *local_208.mv_data;
  pVar5 = *(pgno_t *)((long)local_208.mv_data + 8);
  pVar6 = *(pgno_t *)((long)local_208.mv_data + 0x10);
  pVar7 = *(pgno_t *)((long)local_208.mv_data + 0x18);
  pVar8 = *(pgno_t *)((long)local_208.mv_data + 0x28);
  pMVar3[uVar12].md_entries = *(mdb_size_t *)((long)local_208.mv_data + 0x20);
  (&pMVar3[uVar12].md_entries)[1] = pVar8;
  pMVar3[uVar12].md_leaf_pages = pVar6;
  (&pMVar3[uVar12].md_leaf_pages)[1] = pVar7;
  pMVar3 = pMVar3 + uVar12;
  pMVar3->md_pad = (int)lVar4;
  pMVar3->md_flags = (short)((ulong)lVar4 >> 0x20);
  pMVar3->md_depth = (short)((ulong)lVar4 >> 0x30);
  pMVar3->md_branch_pages = pVar5;
  *dbi = uVar12;
  mdb_default_cmp((MDB_txn *)txn->mt_dbxs,(MDB_dbi)txn->mt_dbs);
  if (bVar9) {
    txn->mt_numdbs = txn->mt_numdbs + 1;
  }
  return 0;
}

Assistant:

int mdb_dbi_open(MDB_txn *txn, const char *name, unsigned int flags, MDB_dbi *dbi)
{
	MDB_val key, data;
	MDB_dbi i;
	MDB_cursor mc;
	MDB_db dummy;
	int rc, dbflag, exact;
	unsigned int unused = 0, seq;
	char *namedup;
	size_t len;

	if (flags & ~VALID_FLAGS)
		return EINVAL;
	if (txn->mt_flags & MDB_TXN_BLOCKED)
		return MDB_BAD_TXN;

	/* main DB? */
	if (!name) {
		*dbi = MAIN_DBI;
		if (flags & PERSISTENT_FLAGS) {
			uint16_t f2 = flags & PERSISTENT_FLAGS;
			/* make sure flag changes get committed */
			if ((txn->mt_dbs[MAIN_DBI].md_flags | f2) != txn->mt_dbs[MAIN_DBI].md_flags) {
				txn->mt_dbs[MAIN_DBI].md_flags |= f2;
				txn->mt_flags |= MDB_TXN_DIRTY;
			}
		}
		mdb_default_cmp(txn, MAIN_DBI);
		return MDB_SUCCESS;
	}

	if (txn->mt_dbxs[MAIN_DBI].md_cmp == NULL) {
		mdb_default_cmp(txn, MAIN_DBI);
	}

	/* Is the DB already open? */
	len = strlen(name);
	for (i=CORE_DBS; i<txn->mt_numdbs; i++) {
		if (!txn->mt_dbxs[i].md_name.mv_size) {
			/* Remember this free slot */
			if (!unused) unused = i;
			continue;
		}
		if (len == txn->mt_dbxs[i].md_name.mv_size &&
			!strncmp(name, txn->mt_dbxs[i].md_name.mv_data, len)) {
			*dbi = i;
			return MDB_SUCCESS;
		}
	}

	/* If no free slot and max hit, fail */
	if (!unused && txn->mt_numdbs >= txn->mt_env->me_maxdbs)
		return MDB_DBS_FULL;

	/* Cannot mix named databases with some mainDB flags */
	if (txn->mt_dbs[MAIN_DBI].md_flags & (MDB_DUPSORT|MDB_INTEGERKEY))
		return (flags & MDB_CREATE) ? MDB_INCOMPATIBLE : MDB_NOTFOUND;

	/* Find the DB info */
	dbflag = DB_NEW|DB_VALID|DB_USRVALID;
	exact = 0;
	key.mv_size = len;
	key.mv_data = (void *)name;
	mdb_cursor_init(&mc, txn, MAIN_DBI, NULL);
	rc = mdb_cursor_set(&mc, &key, &data, MDB_SET, &exact);
	if (rc == MDB_SUCCESS) {
		/* make sure this is actually a DB */
		MDB_node *node = NODEPTR(mc.mc_pg[mc.mc_top], mc.mc_ki[mc.mc_top]);
		if ((node->mn_flags & (F_DUPDATA|F_SUBDATA)) != F_SUBDATA)
			return MDB_INCOMPATIBLE;
	} else if (! (rc == MDB_NOTFOUND && (flags & MDB_CREATE))) {
		return rc;
	}

	/* Done here so we cannot fail after creating a new DB */
	if ((namedup = strdup(name)) == NULL)
		return ENOMEM;

	if (rc) {
		/* MDB_NOTFOUND and MDB_CREATE: Create new DB */
		data.mv_size = sizeof(MDB_db);
		data.mv_data = &dummy;
		memset(&dummy, 0, sizeof(dummy));
		dummy.md_root = P_INVALID;
		dummy.md_flags = flags & PERSISTENT_FLAGS;
		rc = mdb_cursor_put(&mc, &key, &data, F_SUBDATA);
		dbflag |= DB_DIRTY;
	}

	if (rc) {
		free(namedup);
	} else {
		/* Got info, register DBI in this txn */
		unsigned int slot = unused ? unused : txn->mt_numdbs;
		txn->mt_dbxs[slot].md_name.mv_data = namedup;
		txn->mt_dbxs[slot].md_name.mv_size = len;
		txn->mt_dbxs[slot].md_rel = NULL;
		txn->mt_dbflags[slot] = dbflag;
		/* txn-> and env-> are the same in read txns, use
		 * tmp variable to avoid undefined assignment
		 */
		seq = ++txn->mt_env->me_dbiseqs[slot];
		txn->mt_dbiseqs[slot] = seq;

		memcpy(&txn->mt_dbs[slot], data.mv_data, sizeof(MDB_db));
		*dbi = slot;
		mdb_default_cmp(txn, slot);
		if (!unused) {
			txn->mt_numdbs++;
		}
	}

	return rc;
}